

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O2

int __thiscall CTPNStmProg::gen_code_for_build(CTPNStmProg *this)

{
  CTcPrsSymtab *pCVar1;
  CTcTokenizer *pCVar2;
  
  pCVar2 = G_tok;
  G_tok->last_desc_ = (CTcTokFileDesc *)0x0;
  pCVar2->last_linenum_ = 0;
  CTcGenTarg::parsing_done(G_cg);
  pCVar1 = G_prs->global_symtab_;
  G_cs_main->symtab_ = pCVar1;
  G_cs_static->symtab_ = pCVar1;
  (**(this->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
     _vptr_CTcPrsNodeBase)(this,1);
  return (int)(G_tcmain->error_count_ != 0);
}

Assistant:

int CTPNStmProg::gen_code_for_build()
{
    /* notify the tokenizer that parsing is done */
    G_tok->parsing_done();

    /* notify the code generator that we're finished parsing */
    G_cg->parsing_done();

    /* set the global symbol table in the code streams */
    G_cs_main->set_symtab(G_prs->get_global_symtab());
    G_cs_static->set_symtab(G_prs->get_global_symtab());

    /* generate code for the entire program */
    gen_code(TRUE, TRUE);

    /* 
     *   if we encountered any errors generating code, don't bother
     *   writing the image 
     */
    if (G_tcmain->get_error_count() != 0)
        return 1;

    /* return success */
    return 0;
}